

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O0

void __thiscall spdlog::details::registry::flush_every(registry *this,seconds interval)

{
  lock_guard<std::mutex> *in_RDI;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_00000010;
  anon_class_8_1_8991fb9c *in_stack_00000018;
  anon_class_8_1_8991fb9c clbk;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffb8);
  make_unique<spdlog::details::periodic_worker,spdlog::details::registry::flush_every(std::chrono::duration<long,std::ratio<1l,1l>>)::__0&,std::chrono::duration<long,std::ratio<1l,1l>>&>
            (in_stack_00000018,in_stack_00000010);
  std::
  unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
  ::operator=((unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
               *)in_RDI,
              (unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
               *)in_stack_ffffffffffffffb8);
  std::
  unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
  ::~unique_ptr((unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
                 *)in_RDI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x164790);
  return;
}

Assistant:

SPDLOG_INLINE void registry::flush_every(std::chrono::seconds interval)
{
    std::lock_guard<std::mutex> lock(flusher_mutex_);
    auto clbk = [this]() { this->flush_all(); };
    periodic_flusher_ = details::make_unique<periodic_worker>(clbk, interval);
}